

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAWInteractionType.hpp
# Opt level: O2

void __thiscall OpenMD::MAWInteractionType::~MAWInteractionType(MAWInteractionType *this)

{
  NonBondedInteractionType::~NonBondedInteractionType(&this->super_NonBondedInteractionType);
  operator_delete(this,0x88);
  return;
}

Assistant:

MAWInteractionType(RealType myD0, RealType myBeta0, RealType myR0,
                       RealType myCa1, RealType myCb1) {
      D_e  = myD0;
      beta = myBeta0;
      r_e  = myR0;
      ca1  = myCa1;
      cb1  = myCb1;
      setMAW();
    }